

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O0

void placalc::LoadPostLossAmplificationFactors(float secondaryFactor)

{
  float fVar1;
  mapped_type *pmVar2;
  float local_44;
  int local_40;
  int amplification;
  event_amplification ea;
  amplification_factor af;
  event_count ec;
  size_t i;
  FILE *pFStack_18;
  int opts;
  FILE *fin;
  float secondaryFactor_local;
  
  fin._4_4_ = secondaryFactor;
  pFStack_18 = fopen("static/lossfactors.bin","rb");
  if (pFStack_18 != (FILE *)0x0) {
    ec = (event_count)fread((void *)((long)&i + 4),4,1,pFStack_18);
    while ((ec != (event_count)0x0 &&
           (ec = (event_count)fread(&af,8,1,pFStack_18), ec != (event_count)0x0))) {
      local_40 = af.amplification_id;
      local_44 = 0.0;
      while ((local_44 != af.factor &&
             (ec = (event_count)fread(&ea,8,1,pFStack_18), ec != (event_count)0x0))) {
        amplification = ea.event_id;
        fVar1 = ((float)ea.amplification_id - 1.0) * fin._4_4_;
        pmVar2 = std::
                 unordered_map<event_amplification,_float,_placalc::hash_event_amplification,_std::equal_to<event_amplification>,_std::allocator<std::pair<const_event_amplification,_float>_>_>
                 ::operator[]((unordered_map<event_amplification,_float,_placalc::hash_event_amplification,_std::equal_to<event_amplification>,_std::allocator<std::pair<const_event_amplification,_float>_>_>
                               *)factors_,(key_type *)&stack0xffffffffffffffc0);
        *pmVar2 = fVar1 + 1.0;
        local_44 = (float)((int)local_44 + 1);
      }
    }
    return;
  }
  fprintf(_stderr,"FATAL: %s: Error opening file %s\n","LoadPostLossAmplificationFactors",
          "static/lossfactors.bin");
  exit(1);
}

Assistant:

void LoadPostLossAmplificationFactors(const float secondaryFactor) {

    FILE *fin = fopen(PLAFACTORS_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__,
	      PLAFACTORS_FILE);
      exit(EXIT_FAILURE);
    }

    int opts;
    size_t i = fread(&opts, sizeof(opts), 1, fin);

    event_count ec;
    amplification_factor af;
    while (i != 0) {
      i = fread(&ec, sizeof(ec), 1, fin);
      if (i == 0) break;
      event_amplification ea;
      ea.event_id = ec.event_id;
      for (int amplification = 0; amplification != ec.count; ++amplification) {
	i = fread(&af, sizeof(af), 1, fin);
	if (i == 0) break;
	ea.amplification_id = af.amplification_id;
	factors_[ea] = 1. + (af.factor - 1.) * secondaryFactor;
      }
    }

  }